

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O2

void avalues(double *w,int N,int p,int q,double *phi,double *theta,int s,int ps,int qs,double *phis,
            double *thetas,int tval,double *a)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  void *__ptr;
  void *__ptr_00;
  long lVar4;
  void *__ptr_01;
  void *__ptr_02;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  double dVar22;
  double *local_48;
  double *local_38;
  
  uVar3 = (ulong)tval;
  __ptr = malloc((long)N * 8);
  __ptr_00 = malloc(uVar3 << 3);
  uVar21 = q;
  if (q < p) {
    uVar21 = p;
  }
  if ((int)uVar21 <= ps) {
    uVar21 = ps;
  }
  if ((int)uVar21 <= qs) {
    uVar21 = qs;
  }
  iVar1 = tval + N;
  uVar2 = iVar1 + uVar21;
  lVar4 = (long)(int)uVar2;
  __ptr_01 = malloc(lVar4 * 8);
  __ptr_02 = malloc(lVar4 * 8);
  uVar5 = 0;
  uVar7 = (ulong)(uint)N;
  if (N < 1) {
    uVar7 = uVar5;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)__ptr + uVar5 * 8) = 0;
  }
  uVar5 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar5;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)__ptr_01 + uVar5 * 8) = 0;
  }
  iVar12 = 1;
  if (1 < iVar1) {
    iVar12 = iVar1;
  }
  for (uVar5 = 0; iVar12 - 1 != uVar5; uVar5 = uVar5 + 1) {
    a[uVar5] = 0.0;
  }
  uVar5 = 0;
  uVar19 = 0;
  if (0 < tval) {
    uVar19 = (ulong)(uint)tval;
  }
  for (; uVar19 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)__ptr_00 + uVar5 * 8) = 0;
  }
  uVar2 = ~uVar21 + N;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < p) {
    uVar6 = (ulong)(uint)p;
  }
  if (0 < q) {
    uVar5 = (ulong)(uint)q;
  }
  for (; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar16 = (ulong)uVar2;
    dVar22 = 0.0;
    for (uVar15 = 0; uVar6 != uVar15; uVar15 = uVar15 + 1) {
      dVar22 = dVar22 - phi[uVar15] * w[uVar16 + uVar15 + 1];
    }
    for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
      dVar22 = dVar22 + theta[uVar15] * *(double *)((long)__ptr + uVar15 * 8 + uVar16 * 8 + 8);
    }
    *(double *)((long)__ptr + uVar16 * 8) = dVar22 + w[uVar16];
  }
  local_38 = (double *)((long)__ptr_00 + -8);
  lVar14 = 0;
  pvVar11 = __ptr;
  local_48 = w;
  for (uVar16 = 0; uVar16 != uVar19; uVar16 = uVar16 + 1) {
    dVar22 = 0.0;
    pdVar8 = local_38;
    pdVar10 = local_48;
    for (uVar15 = 0; uVar6 != uVar15; uVar15 = uVar15 + 1) {
      pdVar9 = pdVar10;
      if ((long)(lVar14 + uVar15) < 0) {
        pdVar9 = pdVar8;
      }
      dVar22 = dVar22 - phi[uVar15] * *pdVar9;
      pdVar8 = pdVar8 + -1;
      pdVar10 = pdVar10 + 1;
    }
    for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
      if (-1 < (long)(lVar14 + uVar15)) {
        dVar22 = dVar22 + theta[uVar15] * *(double *)((long)pvVar11 + uVar15 * 8);
      }
    }
    *(double *)((long)__ptr_00 + uVar16 * 8) = -dVar22;
    local_38 = local_38 + 1;
    local_48 = local_48 + -1;
    lVar14 = lVar14 + -1;
    pvVar11 = (void *)((long)pvVar11 + -8);
  }
  if (ps < qs) {
    ps = qs;
  }
  if (ps <= q) {
    ps = q;
  }
  iVar1 = uVar21 + tval;
  if (ps <= p) {
    ps = p;
  }
  lVar14 = (long)ps;
  iVar12 = ps + -1;
  lVar20 = lVar14;
  do {
    iVar18 = (int)lVar20;
    if (lVar4 <= lVar20) {
      while (iVar1 = (int)uVar7, uVar7 = (ulong)(iVar1 - 1), iVar1 != 0) {
        *(undefined8 *)((long)__ptr_02 + (long)iVar18 * 8) = 0;
      }
      lVar17 = (long)s;
      lVar20 = lVar14 * 8 + lVar17 * -8;
      pdVar8 = (double *)((long)__ptr_01 + lVar20);
      pdVar10 = (double *)((long)__ptr_02 + lVar20);
      for (lVar20 = lVar14; lVar20 < lVar4; lVar20 = lVar20 + 1) {
        dVar22 = 0.0;
        pdVar9 = pdVar8;
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          dVar22 = dVar22 - phis[uVar3] * *pdVar9;
          pdVar9 = pdVar9 + -lVar17;
        }
        pdVar9 = pdVar10;
        for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
          dVar22 = dVar22 + thetas[uVar3] * *pdVar9;
          pdVar9 = pdVar9 + -lVar17;
        }
        *(double *)((long)__ptr_02 + lVar20 * 8) = dVar22 + *(double *)((long)__ptr_01 + lVar20 * 8)
        ;
        pdVar8 = pdVar8 + 1;
        pdVar10 = pdVar10 + 1;
      }
      iVar1 = 0;
      while (lVar14 = lVar14 + 1, lVar14 < lVar4) {
        a[iVar1] = *(double *)((long)__ptr_02 + lVar14 * 8);
        iVar1 = iVar1 + 1;
      }
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      free(__ptr_02);
      return;
    }
    dVar22 = 0.0;
    iVar13 = iVar12;
    for (lVar17 = 0; uVar6 * 8 - lVar17 != 0; lVar17 = lVar17 + 8) {
      if (iVar13 < iVar1) {
        if ((int)uVar21 <= iVar13) {
          pdVar8 = (double *)((long)__ptr_00 + lVar17 + (long)(int)uVar3 * 8);
          goto LAB_00131920;
        }
      }
      else {
        pdVar8 = w + (iVar13 - iVar1);
LAB_00131920:
        dVar22 = dVar22 - *(double *)((long)phi + lVar17) * *pdVar8;
      }
      iVar13 = iVar13 + -1;
    }
    iVar13 = iVar12;
    for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
      if ((int)uVar21 <= iVar13) {
        dVar22 = dVar22 + theta[uVar19] * *(double *)((long)__ptr_01 + (long)iVar13 * 8);
      }
      iVar13 = iVar13 + -1;
    }
    if (lVar20 < iVar1) {
      if ((int)uVar21 <= lVar20) {
        pdVar8 = (double *)((long)__ptr_00 + (long)(iVar1 - iVar18) * 8 + -8);
        goto LAB_001319ad;
      }
    }
    else {
      pdVar8 = w + (iVar18 - iVar1);
LAB_001319ad:
      *(double *)((long)__ptr_01 + lVar20 * 8) = dVar22 + *pdVar8;
    }
    lVar20 = lVar20 + 1;
    uVar3 = (ulong)((int)uVar3 - 1);
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

void avalues(double *w,int N,int p, int q, double *phi,double *theta,int s,int ps,int qs,
		double *phis, double *thetas,int tval,double *a) {

	int k,i,t,t2,newl,iter;
	double temp;
	double *e,*w2,*alpha,*alpha2;


	e = (double*) malloc(sizeof(double) * N);
	w2 = (double*) malloc(sizeof(double) * tval);

	if (p > q) {
		k = p;
	} else {
		k = q;
	}

	if ( k < ps) {
		k = ps;
	}

	if (k < qs) {
		k = qs;
	}

	alpha = (double*) malloc(sizeof(double) * (tval+N+k));
	alpha2 = (double*) malloc(sizeof(double) * (tval+N+k));

	for(i = 0; i < N;++i) {
		e[i] = 0.0;
	}

	for(i = 0; i < N+tval+k;++i) {
		alpha[i] = 0.0;
	}

	for(i = 0; i < N+tval-1;++i) {
		a[i] = 0.0;
	}

	for(i = 0; i < tval;++i) {
		w2[i] = 0.0;
	}

	for(i = N-k-1; i >= 0; --i) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phi[t] * w[i+t+1];
		}

		for ( t2 = 0; t2 < q;++t2) {
			temp = temp + theta[t2] * e[t2+i+1];
		}

		e[i] = w[i] + temp;
	}

	for(i = 0; i < tval;++i) {
		temp = 0.0;
		for(t = 0; t < p;++t) {
			if (t-i < 0) {
				temp = temp - phi[t]*w2[i-t-1];
			} else {
				temp = temp - phi[t]*w[t-i];
			}
			//printf("temp %g \n",temp);

		}

		for(t2 = 0; t2 < q;++t2) {
			if (t2-i >= 0) {
				temp=temp+theta[t2]*e[t2-i];
			}
		}
		w2[i] = -temp;
	}

	newl = N + tval;


	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;
		for (t = 0; t < p;++t) {
			if (iter-t-1 >= tval+k ) {
				temp = temp - phi[t] * w[iter-t-1-tval-k];
			} else if (iter-t-1 < tval+k && iter-t-1 >= k) {
				temp = temp - phi[t] * w2[k-iter+tval+t];
			}
		}

		for (t2 = 0; t2 < q; ++t2) {
			if (iter-t2-1 >= k ) {
				temp = temp + theta[t2] * alpha[iter-t2-1];
			}
		}

		//printf("%g \n",temp);

		if (iter >= tval+k) {
			alpha[iter] = w[iter-tval-k] + temp;
		} else if (iter >= k){
			alpha[iter] = w2[k-iter+tval-1] + temp;
		}
	}
/*
	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha[iter];
	}
*/
	for(i = 0; i < newl+k;++i) {
		alpha2[iter] = 0.0;
	}

	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phis[t] * alpha[iter - (t+1) * s];
		}

		for (t2 = 0; t2 < q; ++t2) {
			temp = temp + thetas[t2] * alpha2[iter-(t2+1)*s];
		}

		alpha2[iter] = alpha[iter] + temp;

	}

	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha2[iter];
	}


	free(e);
	free(w2);
	free(alpha);
	free(alpha2);

}